

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_56_59(QPDF *pdf,char *arg2,bool handle_from_transformation,bool invert_to_transformation)

{
  Rectangle RVar1;
  ulong uVar2;
  ulong uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  size_type __n;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  allocator<char> local_19a;
  allocator<char> local_199;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188 [3];
  QPDF pdf2;
  int min_suffix;
  QPDFObjectHandle resources;
  QPDFObjectHandle fo;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages2;
  long local_f8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages1;
  long local_e0;
  undefined1 local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [3];
  string content;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  double dStack_38;
  
  local_198._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  if (arg2 != (char *)0x0) {
    QPDF::QPDF(&pdf2);
    QPDF::processFile((char *)&pdf2,arg2);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)&w,(QPDF *)local_198._M_pi);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,&pdf2);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
    uVar2 = (local_e0 - _pages1) / 0x38;
    uVar3 = (local_f8 - _pages2) / 0x38;
    if (uVar2 < uVar3) {
      uVar3 = uVar2;
    }
    for (__n = 0; uVar3 != __n; __n = __n + 1) {
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                              (&pages1,__n);
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at(&pages2,__n);
      QPDFPageObjectHelper::getFormXObjectForPage(SUB81(local_a0,0));
      QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_198._M_pi;
      QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&fo;
      QPDF::copyForeignObject(QVar5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&w,"/Resources",(allocator<char> *)&content);
      QPDFPageObjectHelper::getAttribute((string *)&resources,SUB81(_Var4._M_pi,0));
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&content,"/Fx",(allocator<char> *)&local_120);
      QPDFObjectHandle::getUniqueResourceName((string *)&w,(int *)&resources,(set *)&content);
      std::__cxx11::string::~string((string *)&content);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_130,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&fo);
      QPDFPageObjectHelper::getTrimBox(SUB81(&local_120,0),SUB81(_Var4._M_pi,0));
      QPDFObjectHandle::getArrayAsRectangle();
      RVar1.lly = (double)uStack_48;
      RVar1.llx = (double)local_50;
      RVar1.urx = (double)local_40;
      RVar1.ury = dStack_38;
      QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&content;
      QPDFPageObjectHelper::placeFormXObject
                (QVar6,(string *)&local_130,RVar1,SUB81(&w,0),invert_to_transformation,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_120._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
      if (content._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"<< /XObject << >> >>",&local_19a);
        std::__cxx11::string::string<std::allocator<char>>(local_90,"",&local_199);
        QPDFObjectHandle::parse((string *)local_b0,(string *)&local_120);
        QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
        QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&resources;
        QPDFObjectHandle::mergeResources(QVar7,(map *)0x0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"/XObject",&local_19a);
        QPDFObjectHandle::getKey(local_90);
        QPDFObjectHandle::replaceKey(local_90,(QPDFObjectHandle *)&w);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"q\n",(allocator<char> *)local_90);
        QPDFObjectHandle::newStream((QPDF *)local_c0,(string *)local_198._M_pi);
        QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0;
        QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)_Var4._M_pi;
        QPDFPageObjectHelper::addPageContents(QVar8,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
        std::__cxx11::string::~string((string *)&local_120);
        std::operator+(&local_120,"\nQ\n",&content);
        QPDFObjectHandle::newStream((QPDF *)local_d0,(string *)local_198._M_pi);
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0;
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)_Var4._M_pi;
        QPDFPageObjectHelper::addPageContents(QVar9,false);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
        std::__cxx11::string::~string((string *)&local_120);
      }
      std::__cxx11::string::~string((string *)&content);
      std::__cxx11::string::~string((string *)&w);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&resources.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fo.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    QPDFWriter::QPDFWriter(&w,(QPDF *)local_198._M_pi,"a.pdf");
    QPDFWriter::setQDFMode(SUB81(&w,0));
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_188);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages2);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages1);
    QPDF::~QPDF(&pdf2);
    return;
  }
  __assert_fail("arg2",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x838,"void test_56_59(QPDF &, const char *, bool, bool)");
}

Assistant:

static void
test_56_59(
    QPDF& pdf, char const* arg2, bool handle_from_transformation, bool invert_to_transformation)
{
    // red pages are from pdf, blue pages are from pdf2
    // red pages always have stated rotation absolutely
    // 56: blue pages are overlaid exactly on top of red pages
    // 57: blue pages have stated rotation relative to red pages
    // 58: blue pages have no rotation (absolutely upright)
    // 59: blue pages have stated rotation absolutely

    // Placing form XObjects
    assert(arg2);
    QPDF pdf2;
    pdf2.processFile(arg2);

    std::vector<QPDFPageObjectHelper> pages1 = QPDFPageDocumentHelper(pdf).getAllPages();
    std::vector<QPDFPageObjectHelper> pages2 = QPDFPageDocumentHelper(pdf2).getAllPages();
    size_t npages = (pages1.size() < pages2.size() ? pages1.size() : pages2.size());
    for (size_t i = 0; i < npages; ++i) {
        QPDFPageObjectHelper& ph1 = pages1.at(i);
        QPDFPageObjectHelper& ph2 = pages2.at(i);
        QPDFObjectHandle fo =
            pdf.copyForeignObject(ph2.getFormXObjectForPage(handle_from_transformation));
        int min_suffix = 1;
        QPDFObjectHandle resources = ph1.getAttribute("/Resources", true);
        std::string name = resources.getUniqueResourceName("/Fx", min_suffix);
        std::string content = ph1.placeFormXObject(
            fo, name, ph1.getTrimBox().getArrayAsRectangle(), invert_to_transformation);
        if (!content.empty()) {
            resources.mergeResources(QPDFObjectHandle::parse("<< /XObject << >> >>"));
            resources.getKey("/XObject").replaceKey(name, fo);
            ph1.addPageContents(QPDFObjectHandle::newStream(&pdf, "q\n"), true);
            ph1.addPageContents(QPDFObjectHandle::newStream(&pdf, "\nQ\n" + content), false);
        }
    }
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}